

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O2

void Hop_ObjCollectMulti_rec(Hop_Obj_t *pRoot,Hop_Obj_t *pObj,Vec_Ptr_t *vSuper)

{
  void **ppvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int nCapMin;
  
  for (; (pObj == pRoot ||
         (((((ulong)pObj & 1) == 0 && (uVar2 = *(uint *)&pObj->field_0x20 & 7, uVar2 != 2)) &&
          ((*(uint *)&pRoot->field_0x20 & 7) == uVar2)))); pObj = pObj->pFanin1) {
    Hop_ObjCollectMulti_rec(pRoot,pObj->pFanin0,vSuper);
  }
  uVar2 = vSuper->nSize;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  do {
    if (uVar4 == uVar3) {
      if (uVar2 == vSuper->nCap) {
        nCapMin = 0x10;
        if (0xf < (int)uVar2) {
          nCapMin = uVar2 * 2;
        }
        Vec_PtrGrow(vSuper,nCapMin);
        uVar2 = vSuper->nSize;
      }
      vSuper->nSize = uVar2 + 1;
      vSuper->pArray[(int)uVar2] = pObj;
      return;
    }
    ppvVar1 = vSuper->pArray + uVar3;
    uVar3 = uVar3 + 1;
  } while ((Hop_Obj_t *)*ppvVar1 != pObj);
  return;
}

Assistant:

void Hop_ObjCollectMulti_rec( Hop_Obj_t * pRoot, Hop_Obj_t * pObj, Vec_Ptr_t * vSuper )
{
    if ( pRoot != pObj && (Hop_IsComplement(pObj) || Hop_ObjIsPi(pObj) || Hop_ObjType(pRoot) != Hop_ObjType(pObj)) )
    {
        Vec_PtrPushUnique(vSuper, pObj);
        return;
    }
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild0(pObj), vSuper );
    Hop_ObjCollectMulti_rec( pRoot, Hop_ObjChild1(pObj), vSuper );
}